

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cc
# Opt level: O0

void __thiscall muduo::Logger::Impl::formatTime(Impl *this)

{
  T v;
  T v_00;
  T v_01;
  T v_02;
  bool bVar1;
  char *pcVar2;
  Timestamp *in_RDI;
  long *in_FS_OFFSET;
  Fmt us_1;
  Fmt us;
  int len;
  tm tm_time;
  int microseconds;
  time_t seconds;
  int64_t microSecondsSinceEpoch;
  int in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  int in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  Fmt *in_stack_fffffffffffffeb0;
  T local_120;
  T local_110 [2];
  time_t in_stack_ffffffffffffff18;
  TimeZone *in_stack_ffffffffffffff20;
  T local_d8;
  T local_c8;
  Fmt local_b8;
  int local_94;
  undefined1 local_90 [56];
  tm local_58;
  undefined4 local_1c;
  long local_18;
  int64_t local_10;
  
  local_10 = Timestamp::microSecondsSinceEpoch(in_RDI);
  local_18 = local_10 / 1000000;
  local_1c = (undefined4)(local_10 % 1000000);
  if (local_18 != *(long *)(*in_FS_OFFSET + -0x50)) {
    *(long *)(*in_FS_OFFSET + -0x50) = local_18;
    bVar1 = TimeZone::valid((TimeZone *)0x145596);
    if (bVar1) {
      TimeZone::toLocalTime(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      memcpy(&local_58,local_90,0x38);
    }
    else {
      gmtime_r(&local_18,&local_58);
    }
    local_94 = snprintf((char *)(*in_FS_OFFSET + -0x90),0x40,"%4d%02d%02d %02d:%02d:%02d",
                        (ulong)(local_58.tm_year + 0x76c),(ulong)(local_58.tm_mon + 1),
                        (ulong)(uint)local_58.tm_mday);
    in_stack_fffffffffffffe98 = local_58.tm_hour;
    in_stack_fffffffffffffea0 = local_58.tm_min;
    in_stack_fffffffffffffea8 = local_58.tm_sec;
  }
  bVar1 = TimeZone::valid((TimeZone *)0x145664);
  if (bVar1) {
    Fmt::Fmt<int>(in_stack_fffffffffffffeb0,
                  (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                  in_stack_fffffffffffffea4);
    T::T(&local_c8,(char *)(*in_FS_OFFSET + -0x90),0x11);
    v.str_._4_4_ = in_stack_fffffffffffffe9c;
    v.str_._0_4_ = in_stack_fffffffffffffe98;
    v.len_ = in_stack_fffffffffffffea0;
    v._12_4_ = in_stack_fffffffffffffea4;
    operator<<((LogStream *)0x1456d1,v);
    pcVar2 = Fmt::data(&local_b8);
    T::T(&local_d8,pcVar2,8);
    v_00.str_._4_4_ = in_stack_fffffffffffffe9c;
    v_00.str_._0_4_ = in_stack_fffffffffffffe98;
    v_00.len_ = in_stack_fffffffffffffea0;
    v_00._12_4_ = in_stack_fffffffffffffea4;
    operator<<((LogStream *)0x145711,v_00);
  }
  else {
    Fmt::Fmt<int>(in_stack_fffffffffffffeb0,
                  (char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                  in_stack_fffffffffffffea4);
    T::T(local_110,(char *)(*in_FS_OFFSET + -0x90),0x11);
    v_01.str_._4_4_ = in_stack_fffffffffffffe9c;
    v_01.str_._0_4_ = in_stack_fffffffffffffe98;
    v_01.len_ = in_stack_fffffffffffffea0;
    v_01._12_4_ = in_stack_fffffffffffffea4;
    operator<<((LogStream *)0x14576e,v_01);
    pcVar2 = Fmt::data((Fmt *)((long)&local_110[1].str_ + 4));
    T::T(&local_120,pcVar2,9);
    v_02.str_._4_4_ = in_stack_fffffffffffffe9c;
    v_02.str_._0_4_ = in_stack_fffffffffffffe98;
    v_02.len_ = in_stack_fffffffffffffea0;
    v_02._12_4_ = in_stack_fffffffffffffea4;
    operator<<((LogStream *)0x1457a2,v_02);
  }
  return;
}

Assistant:

void Logger::Impl::formatTime()
{
  int64_t microSecondsSinceEpoch = time_.microSecondsSinceEpoch();
  time_t seconds = static_cast<time_t>(microSecondsSinceEpoch / Timestamp::kMicroSecondsPerSecond);
  int microseconds = static_cast<int>(microSecondsSinceEpoch % Timestamp::kMicroSecondsPerSecond);
  if (seconds != t_lastSecond)
  {
    t_lastSecond = seconds;
    struct tm tm_time;
    if (g_logTimeZone.valid())
    {
      tm_time = g_logTimeZone.toLocalTime(seconds);
    }
    else
    {
      ::gmtime_r(&seconds, &tm_time); // FIXME TimeZone::fromUtcTime
    }

    int len = snprintf(t_time, sizeof(t_time), "%4d%02d%02d %02d:%02d:%02d",
        tm_time.tm_year + 1900, tm_time.tm_mon + 1, tm_time.tm_mday,
        tm_time.tm_hour, tm_time.tm_min, tm_time.tm_sec);
    assert(len == 17); (void)len;
  }

  if (g_logTimeZone.valid())
  {
    Fmt us(".%06d ", microseconds);
    assert(us.length() == 8);
    stream_ << T(t_time, 17) << T(us.data(), 8);
  }
  else
  {
    Fmt us(".%06dZ ", microseconds);
    assert(us.length() == 9);
    stream_ << T(t_time, 17) << T(us.data(), 9);
  }
}